

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitting_settings.cpp
# Opt level: O0

bool get_fitting_settings_from_command_line(fitting_settings *output,int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  logic_error *plVar5;
  float fVar6;
  undefined1 local_2e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  size_type assignmentOperator;
  allocator<char> local_279;
  string local_278 [8];
  string argument;
  string local_250 [4];
  int argId;
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  fitting_settings local_98;
  char **local_20;
  char **argv_local;
  fitting_settings *pfStack_10;
  int argc_local;
  fitting_settings *output_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  pfStack_10 = output;
  fitting_settings::fitting_settings(&local_98);
  fitting_settings::operator=(pfStack_10,&local_98);
  fitting_settings::~fitting_settings(&local_98);
  std::__cxx11::string::operator=((string *)&pfStack_10->brdf_method,"ggx");
  pfStack_10->resolution = 0x40;
  pfStack_10->min_roughness = 0.0001;
  pfStack_10->max_roughness = 1.0;
  pfStack_10->num_error_estimate_samples = 0x20;
  std::__cxx11::stringstream::stringstream(local_220);
  poVar3 = std::operator<<(local_210,"result_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pfStack_10->resolution);
  poVar3 = std::operator<<(poVar3,"x");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pfStack_10->resolution);
  std::operator<<(poVar3,".ltc");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&pfStack_10->output_file,local_250);
  std::__cxx11::string::~string(local_250);
  argument.field_2._12_4_ = 1;
  while( true ) {
    if (argv_local._4_4_ <= (int)argument.field_2._12_4_) {
      std::__cxx11::stringstream::~stringstream(local_220);
      return true;
    }
    __s = local_20[(int)argument.field_2._12_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_278,__s,&local_279);
    std::allocator<char>::~allocator(&local_279);
    poVar3 = std::operator<<((ostream *)&std::cout,"arg: ");
    poVar3 = std::operator<<(poVar3,local_278);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::substr((ulong)&assignmentOperator,(ulong)local_278);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &assignmentOperator,"--");
    std::__cxx11::string::~string((string *)&assignmentOperator);
    if (bVar1) break;
    lVar4 = std::__cxx11::string::find_first_of((char)local_278,0x3d);
    if (lVar4 == -1) {
      plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar5,"Argument assignment has assignment operator.");
      __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)local_278);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_2e8,(ulong)local_278);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&value.field_2 + 8),"brdf");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&pfStack_10->brdf_method,(string *)local_2e8);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&value.field_2 + 8),"resolution");
      if (bVar1) {
        iVar2 = std::__cxx11::stoi((string *)local_2e8,(size_t *)0x0,10);
        pfStack_10->resolution = iVar2;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&value.field_2 + 8),"min-roughness");
        if (bVar1) {
          fVar6 = std::__cxx11::stof((string *)local_2e8,(size_t *)0x0);
          pfStack_10->min_roughness = fVar6;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&value.field_2 + 8),"output");
          if (bVar1) {
            std::__cxx11::string::operator=((string *)&pfStack_10->output_file,(string *)local_2e8);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_2e8);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_278);
    argument.field_2._12_4_ = argument.field_2._12_4_ + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Unrecognized argument \"");
  poVar3 = std::operator<<(poVar3,local_278);
  std::operator<<(poVar3,"\". Aborting.");
  plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar5,"Unrecognized argument.");
  __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool get_fitting_settings_from_command_line(
  fitting_settings &output,
  int argc,
  const char *argv[]
)
{
  output = fitting_settings();

  output.brdf_method = "ggx";
  output.resolution = 64;
  output.min_roughness = 0.0001f;
  output.max_roughness = 1.0f;
  output.num_error_estimate_samples = 32;

  std::stringstream ss;
  ss << "result_" << output.resolution << "x" << output.resolution << ".ltc";
  output.output_file = ss.str();

  for (auto argId = 1; argId < argc; ++argId) {
    std::string argument = argv[argId];
    std::cout << "arg: " << argument << std::endl;
    if (argument.substr(0, 2) != "--") {
      std::cerr << "Unrecognized argument \"" << argument << "\". Aborting.";
      throw std::logic_error("Unrecognized argument.");
    }

    auto assignmentOperator = argument.find_first_of('=');
    if (assignmentOperator == -1) {
      throw std::logic_error("Argument assignment has assignment operator.");
    }

    auto key = argument.substr(2, assignmentOperator - 2);
    auto value = argument.substr(assignmentOperator + 1, argument.length() - assignmentOperator - 1);

    if (key == "brdf") {
      output.brdf_method = value;
    }
    else if (key == "resolution") {
      output.resolution = std::stoi(value);
    }
    else if (key == "min-roughness") {
      output.min_roughness = std::stof(value);
    }
    else if (key == "output") {
      output.output_file = value;
    }
  }

  return true;
}